

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O3

void __thiscall
QStandardItemModelPrivate::_q_emitItemChanged
          (QStandardItemModelPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QScopedPointer<QStandardItem,_QScopedPointerDeleter<QStandardItem>_> *pQVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  uint local_88;
  uint uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStandardItem *local_50;
  void *local_48;
  QStandardItem **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = (topLeft->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_68 = (undefined1 *)0xffffffffffffffff;
    puStack_60 = (undefined1 *)0x0;
    local_58 = (undefined1 *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar2 + 0x68))(&local_68,pQVar2,topLeft);
  }
  iVar5 = bottomRight->r;
  if (topLeft->r <= iVar5) {
    iVar6 = bottomRight->c;
    iVar8 = topLeft->r;
    do {
      iVar9 = topLeft->c;
      if (topLeft->c <= iVar6) {
        do {
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = 0xaaaaaaaa;
          uStack_84 = 0xaaaaaaaa;
          uStack_80 = 0xaaaaaaaa;
          uStack_7c = 0xaaaaaaaa;
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_88,pQVar1,iVar8,iVar9,&local_68);
          pQVar7 = &this->root;
          if (local_78 == (undefined1 *)0x0 || (int)(local_88 | uStack_84) < 0) {
LAB_00544d95:
            if (pQVar7->d != (QStandardItem *)0x0) {
              local_48 = (void *)0x0;
              local_40 = &local_50;
              local_50 = pQVar7->d;
              QMetaObject::activate(pQVar1,&QStandardItemModel::staticMetaObject,0,&local_48);
            }
          }
          else if ((((local_78 == *(undefined1 **)&this->field_0x8) &&
                    (CONCAT44(uStack_7c,uStack_80) != 0)) &&
                   (lVar3 = *(long *)(CONCAT44(uStack_7c,uStack_80) + 8),
                   (int)local_88 < *(int *)(lVar3 + 0x40))) &&
                  ((int)uStack_84 < *(int *)(lVar3 + 0x44))) {
            pQVar7 = (QScopedPointer<QStandardItem,_QScopedPointerDeleter<QStandardItem>_> *)
                     ((ulong)(*(int *)(lVar3 + 0x44) * local_88 + uStack_84) * 8 +
                     *(long *)(lVar3 + 0x30));
            goto LAB_00544d95;
          }
          iVar6 = bottomRight->c;
          bVar4 = iVar9 < iVar6;
          iVar9 = iVar9 + 1;
        } while (bVar4);
        iVar5 = bottomRight->r;
      }
      bVar4 = iVar8 < iVar5;
      iVar8 = iVar8 + 1;
    } while (bVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemModelPrivate::_q_emitItemChanged(const QModelIndex &topLeft,
                                                   const QModelIndex &bottomRight)
{
    Q_Q(QStandardItemModel);
    QModelIndex parent = topLeft.parent();
    for (int row = topLeft.row(); row <= bottomRight.row(); ++row) {
        for (int column = topLeft.column(); column <= bottomRight.column(); ++column) {
            QModelIndex index = q->index(row, column, parent);
            if (QStandardItem *item = itemFromIndex(index))
                emit q->itemChanged(item);
        }
    }
}